

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toktx.cc
# Opt level: O3

void __thiscall
toktxApp::genMipmap(toktxApp *this,unique_ptr<Image,_std::default_delete<Image>_> *pImage,
                   uint32_t layer,uint32_t faceSlice,ktxTexture *texture)

{
  Image *pIVar1;
  PFNKTEXSETIMAGEFROMMEMORY p_Var2;
  long *plVar3;
  uint uVar4;
  ktx_error_code_e kVar5;
  ktx_uint8_t *pkVar6;
  ktx_size_t kVar7;
  uint uVar8;
  ktx_uint32_t kVar9;
  pointer __old_p;
  long *plVar10;
  stringstream message;
  long *local_1b8 [49];
  
  if (1 < texture->numLevels) {
    kVar9 = 1;
    plVar10 = (long *)0x0;
    do {
      pIVar1 = (pImage->_M_t).super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
               super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
               super__Head_base<0UL,_Image_*,_false>._M_head_impl;
      uVar8 = pIVar1->width >> ((byte)kVar9 & 0x1f);
      uVar4 = pIVar1->height >> ((byte)kVar9 & 0x1f);
      (*pIVar1->_vptr_Image[0x11])
                ((this->options).gmopts.filterScale,local_1b8,pIVar1,(ulong)(uVar8 + (uVar8 == 0)),
                 (ulong)(uVar4 + (uVar4 == 0)),(this->options).gmopts.filter._M_dataplus._M_p,
                 (ulong)(this->options).gmopts.wrapMode);
      plVar3 = local_1b8[0];
      local_1b8[0] = (long *)0x0;
      if (plVar10 != (long *)0x0) {
        (**(code **)(*plVar10 + 8))(plVar10);
        if (local_1b8[0] != (long *)0x0) {
          (**(code **)(*local_1b8[0] + 8))();
        }
      }
      if ((this->options).super_commandOptions.normalize == true) {
        (**(code **)(*plVar3 + 0xa0))(plVar3);
      }
      p_Var2 = texture->vtbl->SetImageFromMemory;
      pkVar6 = (ktx_uint8_t *)(**(code **)(*plVar3 + 0x10))(plVar3);
      kVar7 = (**(code **)(*plVar3 + 0x18))(plVar3);
      kVar5 = (*p_Var2)(texture,kVar9,layer,faceSlice,pkVar6,kVar7);
      if (kVar5 != KTX_SUCCESS) {
        __assert_fail("ret == KTX_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                      ,0x4dc,
                      "void toktxApp::genMipmap(unique_ptr<Image>, uint32_t, uint32_t, ktxTexture *)"
                     );
      }
      kVar9 = kVar9 + 1;
      plVar10 = plVar3;
    } while (kVar9 < texture->numLevels);
    (**(code **)(*plVar3 + 8))(plVar3);
  }
  return;
}

Assistant:

void
toktxApp::genMipmap(unique_ptr<Image> pImage,
                    uint32_t layer, uint32_t faceSlice,
                    ktxTexture* texture)
{
    unique_ptr<Image> levelImage;
    for (uint32_t glevel = 1; glevel < texture->numLevels; glevel++) {
        auto levelWidth = maximum<uint32_t>(1, pImage->getWidth() >> glevel);
        auto levelHeight = maximum<uint32_t>(1, pImage->getHeight() >> glevel);
        try {
            levelImage = pImage->resample(levelWidth, levelHeight,
                                    options.gmopts.filter.c_str(),
                                    options.gmopts.filterScale,
                                    options.gmopts.wrapMode);
        } catch (runtime_error& e) {
            stringstream message;
            message << "Image::resample() failed! " << e.what();
            cant_create_image(message.str());
        }

        if (options.normalize)
            levelImage->normalize();

        MAYBE_UNUSED ktx_error_code_e ret;
        ret = ktxTexture_SetImageFromMemory(texture,
                                      glevel,
                                      layer,
                                      faceSlice,
                                      *levelImage,
                                      levelImage->getByteCount());
        assert(ret == KTX_SUCCESS);
    }
}